

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-concurrency.c
# Opt level: O3

void test_stream_concurrency(void)

{
  long *plVar1;
  byte bVar2;
  uint uVar3;
  quicly_sendbuf_t *sb;
  quicly_stream_id_t stream_id;
  void *pvVar4;
  long lVar5;
  long lVar6;
  uint64_t uVar7;
  quicly_conn_t *pqVar8;
  quicly_conn_t *pqVar9;
  int iVar10;
  quicly_cid_plaintext_t *pqVar11;
  size_t sVar12;
  quicly_stream_t *pqVar13;
  quicly_streambuf_t *sbuf;
  uint64_t uVar14;
  uint64_t uVar15;
  undefined1 *buf;
  uint64_t uVar16;
  long lVar17;
  bool bVar18;
  undefined8 uStack_170;
  ptls_iovec_t pStack_168;
  uint64_t auStack_158 [2];
  undefined1 local_148 [8];
  quicly_decoded_packet_t decoded;
  quicly_address_t dest;
  quicly_address_t src;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  iovec raw;
  size_t num_packets;
  quicly_conn_t *local_40;
  quicly_conn_t *server;
  quicly_conn_t *client;
  
  uVar15 = quic_ctx.transport_params.max_udp_payload_size;
  uVar7 = quic_ctx.transport_params.max_streams_bidi;
  lVar5 = -0x148 - (quic_ctx.transport_params.max_streams_bidi * 8 + 0x1f & 0xfffffffffffffff0);
  lVar6 = lVar5 - ((quic_ctx.transport_params.max_streams_bidi + 1) * 8 + 0xf & 0xfffffffffffffff0);
  buf = local_148 +
        (lVar6 - (quic_ctx.transport_params.max_udp_payload_size + 0xf & 0xfffffffffffffff0)) +
        0x148;
  *(undefined8 *)(buf + -8) = 0x12108e;
  pqVar11 = new_master_id();
  src._20_8_ = 0;
  uStack_80 = 0;
  *(undefined8 *)(buf + -0x20) = 0;
  *(undefined8 *)(buf + -0x18) = 0;
  *(undefined8 *)(buf + -0x10) = 0;
  *(undefined8 *)(buf + -8) = 0;
  *(undefined8 *)(buf + -0x28) = 0x1210cc;
  iVar10 = quicly_connect(&server,&quic_ctx,"example.com",&fake_address.sa,(sockaddr *)0x0,pqVar11,
                          *(ptls_iovec_t *)(buf + -0x20),
                          *(ptls_handshake_properties_t **)(buf + -0x10),
                          *(quicly_transport_parameters_t **)(buf + -8));
  *(undefined8 *)(buf + -8) = 0x1210f2;
  _ok((uint)(iVar10 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x2c);
  pqVar8 = server;
  raw.iov_len = 1;
  *(uint64_t *)(buf + -0x10) = uVar15;
  *(undefined8 *)(buf + -0x18) = 0x121126;
  iVar10 = quicly_send(pqVar8,(quicly_address_t *)&decoded._is_stateless_reset_cached,
                       (quicly_address_t *)((long)&dest.sin6.sin6_addr.__in6_u + 0xc),
                       (iovec *)local_78,&raw.iov_len,buf,*(size_t *)(buf + -0x10));
  *(undefined8 *)(buf + -8) = 0x121152;
  _ok((uint)(iVar10 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x2f);
  bVar18 = raw.iov_len == 1;
  *(undefined8 *)(buf + -8) = 0x12116e;
  _ok((uint)bVar18,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x30);
  *(undefined8 *)(buf + -8) = 0x121183;
  sVar12 = decode_packets((quicly_decoded_packet_t *)local_148,(iovec *)local_78,1);
  *(undefined8 *)(buf + -8) = 0x12119f;
  _ok((uint)(sVar12 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x31);
  bVar18 = raw.iov_len == 1;
  *(undefined8 *)(buf + -8) = 0x1211bb;
  _ok((uint)bVar18,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x32);
  *(undefined8 *)(buf + -8) = 0x1211c0;
  pqVar11 = new_master_id();
  *(undefined8 *)(buf + -8) = 0;
  *(quicly_cid_plaintext_t **)(buf + -0x10) = pqVar11;
  *(undefined8 *)(buf + -0x18) = 0x1211e9;
  iVar10 = quicly_accept(&local_40,&quic_ctx,(sockaddr *)0x0,&fake_address.sa,
                         (quicly_decoded_packet_t *)local_148,
                         (quicly_address_token_plaintext_t *)0x0,
                         *(quicly_cid_plaintext_t **)(buf + -0x10),
                         *(ptls_handshake_properties_t **)(buf + -8));
  *(undefined8 *)(buf + -8) = 0x121207;
  _ok((uint)(iVar10 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x34);
  pqVar9 = server;
  pqVar8 = local_40;
  *(undefined8 *)(buf + -8) = 0x121216;
  transmit(pqVar8,pqVar9);
  uVar16 = uVar7 + 1;
  uVar15 = 0;
  if (uVar16 != 0) {
    lVar17 = 0;
    uVar14 = 0;
    do {
      pqVar8 = server;
      *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121242;
      iVar10 = quicly_open_stream(pqVar8,(quicly_stream_t **)(local_148 + lVar17 + lVar5 + 0x148),0)
      ;
      if (iVar10 != 0) {
        *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x12151a;
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
                      ,0x3b,"void test_stream_concurrency(void)");
      }
      pqVar13 = *(quicly_stream_t **)(local_148 + uVar14 * 8 + lVar5 + 0x148);
      sb = (quicly_sendbuf_t *)pqVar13->data;
      *(quicly_sendbuf_t **)(local_148 + uVar14 * 8 + lVar6 + 0x148) = sb;
      uVar15 = uVar14;
      if ((pqVar13->field_0xb8 & 1) != 0) break;
      *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121273;
      iVar10 = quicly_sendbuf_write(pqVar13,sb,"hello",5);
      if (iVar10 != 0) {
        *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121539;
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
                      ,0x40,"void test_stream_concurrency(void)");
      }
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + 8;
      uVar15 = uVar16;
    } while (uVar16 != uVar14);
  }
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1212b7;
  _ok((uint)(uVar15 == uVar7),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x42);
  pqVar9 = server;
  pqVar8 = local_40;
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1212c4;
  transmit(pqVar9,pqVar8);
  pqVar9 = server;
  pqVar8 = local_40;
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1212d1;
  transmit(pqVar8,pqVar9);
  plVar1 = (long *)(local_148 + uVar15 * 8 + lVar5 + 0x148);
  bVar2 = *(byte *)(*plVar1 + 0xb8);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1212f9;
  _ok(bVar2 & 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x48);
  pqVar8 = local_40;
  stream_id = *(quicly_stream_id_t *)(plVar1[-1] + 8);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x12130a;
  pqVar13 = quicly_get_stream(pqVar8,stream_id);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121328;
  _ok((uint)(pqVar13 != (quicly_stream_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x4c);
  pvVar4 = pqVar13->data;
  pqVar13 = (quicly_stream_t *)plVar1[-1];
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x12133e;
  quicly_reset_stream(pqVar13,0x3007b);
  pqVar13 = (quicly_stream_t *)plVar1[-1];
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x12134c;
  quicly_request_stop(pqVar13,0x301c8);
  pqVar9 = server;
  pqVar8 = local_40;
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121359;
  transmit(pqVar9,pqVar8);
  pqVar9 = server;
  pqVar8 = local_40;
  quic_now = quic_now + 0x19;
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121371;
  transmit(pqVar8,pqVar9);
  iVar10 = *(int *)((long)pvVar4 + 0x4c);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121392;
  _ok((uint)(iVar10 == 0x3007b),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x53);
  iVar10 = *(int *)((long)pvVar4 + 0x48);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1213b4;
  _ok((uint)(iVar10 == 0x301c8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x54);
  iVar10 = *(int *)((long)pvVar4 + 0x50);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1213d2;
  _ok((uint)(iVar10 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x55);
  lVar5 = *(long *)((long)auStack_158 + uVar15 * 8 + lVar6 + 0x150);
  iVar10 = *(int *)(lVar5 + 0x4c);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1213fc;
  _ok((uint)(iVar10 == 0x301c8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x56);
  iVar10 = *(int *)(lVar5 + 0x50);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121412;
  _ok(iVar10,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x57);
  bVar2 = *(byte *)(*plVar1 + 0xb8);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121432;
  _ok(bVar2 & 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x5a);
  pqVar9 = server;
  pqVar8 = local_40;
  quic_now = quic_now + 0x19;
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x12144a;
  transmit(pqVar9,pqVar8);
  pqVar9 = server;
  pqVar8 = local_40;
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x121457;
  transmit(pqVar8,pqVar9);
  iVar10 = *(int *)((long)pvVar4 + 0x50);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x12146e;
  _ok(iVar10,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x61);
  uVar3 = *(uint *)(*plVar1 + 0xb8);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x12148f;
  _ok(~uVar3 & 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x62);
  pqVar8 = server;
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x12149d;
  iVar10 = quicly_open_stream(pqVar8,(quicly_stream_t **)(plVar1 + 1),0);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1214b7;
  _ok((uint)(iVar10 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x67);
  bVar2 = ((quicly_stream_t *)plVar1[1])->field_0xb8;
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1214d6;
  _ok(bVar2 & 1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/stream-concurrency.c"
      ,0x68);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1214df;
  quicly_free(server);
  *(undefined8 *)((long)auStack_158 + lVar6 + 0x150) = 0x1214e8;
  quicly_free(local_40);
  return;
}

Assistant:

void test_stream_concurrency(void)
{
    quicly_conn_t *client, *server;
    size_t limit = quic_ctx.transport_params.max_streams_bidi;
    quicly_stream_t *client_streams[limit + 2], *server_stream;
    test_streambuf_t *client_streambufs[limit + 1], *server_streambuf;
    size_t i;
    int ret;

    { /* connect */
        quicly_address_t dest, src;
        struct iovec raw;
        uint8_t rawbuf[quic_ctx.transport_params.max_udp_payload_size];
        size_t num_packets;
        quicly_decoded_packet_t decoded;

        ret = quicly_connect(&client, &quic_ctx, "example.com", &fake_address.sa, NULL, new_master_id(), ptls_iovec_init(NULL, 0),
                             NULL, NULL);
        ok(ret == 0);
        num_packets = 1;
        ret = quicly_send(client, &dest, &src, &raw, &num_packets, rawbuf, sizeof(rawbuf));
        ok(ret == 0);
        ok(num_packets == 1);
        ok(decode_packets(&decoded, &raw, 1) == 1);
        ok(num_packets == 1);
        ret = quicly_accept(&server, &quic_ctx, NULL, &fake_address.sa, &decoded, NULL, new_master_id(), NULL);
        ok(ret == 0);
        transmit(server, client);
    }

    /* open as many streams as we can */
    for (i = 0; i < limit + 1; ++i) {
        ret = quicly_open_stream(client, client_streams + i, 0);
        assert(ret == 0);
        client_streambufs[i] = client_streams[i]->data;
        if (client_streams[i]->streams_blocked)
            break;
        ret = quicly_streambuf_egress_write(client_streams[i], "hello", 5);
        assert(ret == 0);
    }
    ok(i == limit);

    transmit(client, server);
    transmit(server, client);

    /* the last stream is still ID-blocked after 1RT */
    ok(client_streams[i]->streams_blocked);

    /* reset one stream in both directions and close on the client-side */
    server_stream = quicly_get_stream(server, client_streams[i - 1]->stream_id);
    ok(server_stream != NULL);
    server_streambuf = server_stream->data;
    quicly_reset_stream(client_streams[i - 1], QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(123));
    quicly_request_stop(client_streams[i - 1], QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(456));
    transmit(client, server);
    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(server, client);
    ok(server_streambuf->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(123));
    ok(server_streambuf->error_received.stop_sending == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(456));
    ok(!server_streambuf->is_detached); /* haven't gotten ACK for reset */
    ok(client_streambufs[i - 1]->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(456));
    ok(client_streambufs[i - 1]->is_detached);

    /* the last stream is still ID-blocked */
    ok(client_streams[i]->streams_blocked);

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(client, server);
    transmit(server, client);

    /* we would have free room now that RST of the server-sent side is ACKed */
    ok(server_streambuf->is_detached);
    ok(!client_streams[i]->streams_blocked);
    ++i;

    /* but we cannot open one more */
    ret = quicly_open_stream(client, client_streams + i, 0);
    ok(ret == 0);
    ok(client_streams[i]->streams_blocked);

    quicly_free(client);
    quicly_free(server);
}